

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pspr.cpp
# Opt level: O3

int AF_A_GunFlash(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  undefined8 *puVar2;
  player_t *this;
  PClass *pPVar3;
  undefined8 in_RAX;
  PClass *pPVar4;
  FState *newstate;
  DPSprite *this_00;
  undefined4 in_register_00000014;
  ulong uVar5;
  undefined8 *puVar6;
  VMValue *pVVar7;
  char *__assertion;
  AWeapon *this_01;
  bool bVar8;
  bool bVar9;
  undefined1 auVar10 [16];
  undefined8 local_38;
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  uVar5 = CONCAT44(in_register_00000014,numparam);
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_0055afa1;
  }
  if ((param->field_0).field_3.Type != '\x03') goto LAB_0055af91;
  puVar6 = (undefined8 *)(param->field_0).field_1.a;
  local_38 = in_RAX;
  if ((param->field_0).field_1.atag == 1) {
    if (puVar6 == (undefined8 *)0x0) goto LAB_0055adc7;
    auVar10._8_8_ = uVar5;
    auVar10._0_8_ = puVar6[1];
    if (puVar6[1] == 0) {
      auVar10 = (**(code **)*puVar6)(puVar6);
      puVar6[1] = auVar10._0_8_;
    }
    pPVar4 = auVar10._0_8_;
    bVar8 = pPVar4 == (PClass *)0x0;
    ret = (VMReturn *)(ulong)!bVar8;
    uVar5 = (ulong)bVar8;
    bVar9 = pPVar4 == pPVar3;
    if (!bVar9 && !bVar8) {
      do {
        pPVar4 = pPVar4->ParentClass;
        ret = (VMReturn *)(ulong)(pPVar4 != (PClass *)0x0);
        if (pPVar4 == pPVar3) break;
      } while (pPVar4 != (PClass *)0x0);
    }
    pVVar7 = (VMValue *)(ulong)(bVar9 || bVar8);
    if ((char)ret == '\0') {
      __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_0055afa1;
    }
  }
  else {
    if (puVar6 != (undefined8 *)0x0) goto LAB_0055af91;
LAB_0055adc7:
    puVar6 = (undefined8 *)0x0;
    pVVar7 = param;
  }
  pPVar3 = AActor::RegistrationInfo.MyClass;
  bVar8 = true;
  if (numparam == 1) {
LAB_0055ae93:
    newstate = (FState *)0x0;
  }
  else {
    VVar1 = param[1].field_0.field_3.Type;
    if (VVar1 != 0xff) {
      if (VVar1 != '\x03') {
LAB_0055af91:
        __assertion = 
        "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
        ;
        goto LAB_0055afa1;
      }
      puVar2 = (undefined8 *)param[1].field_0.field_1.a;
      if (param[1].field_0.field_1.atag == 1) {
        if (puVar2 != (undefined8 *)0x0) {
          pPVar4 = (PClass *)puVar2[1];
          if (pPVar4 == (PClass *)0x0) {
            pPVar4 = (PClass *)(**(code **)*puVar2)(puVar2,pVVar7,uVar5,ret);
            puVar2[1] = pPVar4;
          }
          bVar9 = pPVar4 != (PClass *)0x0;
          if (pPVar4 != pPVar3 && bVar9) {
            do {
              pPVar4 = pPVar4->ParentClass;
              bVar9 = pPVar4 != (PClass *)0x0;
              if (pPVar4 == pPVar3) break;
            } while (pPVar4 != (PClass *)0x0);
          }
          if (!bVar9) {
            __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
            goto LAB_0055afa1;
          }
        }
      }
      else if (puVar2 != (undefined8 *)0x0) goto LAB_0055af91;
    }
    if (numparam < 3) goto LAB_0055ae93;
    VVar1 = param[2].field_0.field_3.Type;
    if ((VVar1 != 0xff) &&
       ((VVar1 != '\x03' ||
        ((param[2].field_0.field_1.atag != 8 && (param[2].field_0.field_1.a != (void *)0x0)))))) {
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
LAB_0055afa1:
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                    ,0x4c2,"int AF_A_GunFlash(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
    if (numparam == 3) goto LAB_0055ae93;
    VVar1 = param[3].field_0.field_3.Type;
    if (VVar1 == 0xff) {
LAB_0055af44:
      newstate = (FState *)0x0;
    }
    else {
      if (VVar1 != '\x03') {
LAB_0055afc2:
        __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATE || param[paramnum].a == NULL)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                      ,0x4c3,"int AF_A_GunFlash(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
      newstate = (FState *)param[3].field_0.field_1.a;
      if (param[3].field_0.field_1.atag != 7) {
        if (newstate != (FState *)0x0) goto LAB_0055afc2;
        goto LAB_0055af44;
      }
    }
    if (4 < (uint)numparam) {
      VVar1 = param[4].field_0.field_3.Type;
      if (VVar1 == '\0') {
        bVar8 = (undefined1  [16])((undefined1  [16])param[4].field_0 & (undefined1  [16])0x1) ==
                (undefined1  [16])0x0;
      }
      else if (VVar1 != 0xff) {
        __assert_fail("param[paramnum].Type == REGT_INT",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                      ,0x4c4,"int AF_A_GunFlash(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
    }
  }
  this = (player_t *)puVar6[0x40];
  if (this == (player_t *)0x0) {
    return 0;
  }
  if (bVar8) {
    APlayerPawn::PlayAttacking2(this->mo);
  }
  if (newstate == (FState *)0x0) {
    this_01 = this->ReadyWeapon;
    if (this_01->bAltFire == true) {
      local_38 = CONCAT44(0xa4,local_38._0_4_);
      newstate = AActor::FindState((AActor *)this_01,(FName *)((long)&local_38 + 4));
      if (newstate != (FState *)0x0) goto LAB_0055aef4;
      this_01 = this->ReadyWeapon;
    }
    local_38 = CONCAT44(local_38._4_4_,0xa3);
    newstate = AActor::FindState((AActor *)this_01,(FName *)&local_38);
  }
LAB_0055aef4:
  this_00 = player_t::GetPSprite(this,PSP_FLASH);
  DPSprite::SetState(this_00,newstate,false);
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION_PARAMS(AInventory, A_GunFlash)
{
	PARAM_ACTION_PROLOGUE;
	PARAM_STATE_OPT(flash)	{ flash = nullptr; }
	PARAM_INT_OPT  (flags)	{ flags = 0; }

	player_t *player = self->player;

	if (nullptr == player)
	{
		return 0;
	}
	if (!(flags & GFF_NOEXTCHANGE))
	{
		player->mo->PlayAttacking2 ();
	}
	if (flash == nullptr)
	{
		if (player->ReadyWeapon->bAltFire)
		{
			flash = player->ReadyWeapon->FindState(NAME_AltFlash);
		}
		if (flash == nullptr)
		{
			flash = player->ReadyWeapon->FindState(NAME_Flash);
		}
	}
	P_SetPsprite(player, PSP_FLASH, flash);
	return 0;
}